

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::InitializeDiskSourceTree
          (CommandLineInterface *this,DiskSourceTree *source_tree,
          DescriptorDatabase *fallback_database)

{
  string_view disk_path;
  string_view virtual_path;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong local_30;
  size_t i;
  DescriptorDatabase *fallback_database_local;
  DiskSourceTree *source_tree_local;
  CommandLineInterface *this_local;
  
  anon_unknown_5::AddDefaultProtoPaths(&this->proto_path_);
  for (local_30 = 0;
      sVar2 = std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size(&this->proto_path_), local_30 < sVar2; local_30 = local_30 + 1) {
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->proto_path_,local_30);
    virtual_path = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar3);
    pvVar3 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->proto_path_,local_30);
    disk_path = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pvVar3->second);
    DiskSourceTree::MapPath(source_tree,virtual_path,disk_path);
  }
  bVar1 = MakeInputsBeProtoPathRelative(this,source_tree,fallback_database);
  return bVar1;
}

Assistant:

bool CommandLineInterface::InitializeDiskSourceTree(
    DiskSourceTree* source_tree, DescriptorDatabase* fallback_database) {
  AddDefaultProtoPaths(&proto_path_);

  // Set up the source tree.
  for (size_t i = 0; i < proto_path_.size(); ++i) {
    source_tree->MapPath(proto_path_[i].first, proto_path_[i].second);
  }

  // Map input files to virtual paths if possible.
  if (!MakeInputsBeProtoPathRelative(source_tree, fallback_database)) {
    return false;
  }

  return true;
}